

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O1

int StoreImageToBitMask(VP8LBitWriter *bw,int width,int histo_bits,VP8LBackwardRefs *refs,
                       uint32_t *histogram_symbols,HuffmanTreeCode *huffman_codes,WebPPicture *pic)

{
  byte bVar1;
  ushort uVar2;
  uint32_t uVar3;
  byte bVar4;
  PixOrCopy *pPVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint16_t **ppuVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  VP8LRefsCursor c;
  HuffmanTreeCode *local_90;
  uint local_74;
  uint local_70;
  VP8LRefsCursor local_48;
  
  bVar4 = (byte)histo_bits;
  uVar12 = (width + (1 << (bVar4 & 0x1f))) - 1U >> (bVar4 & 0x1f);
  uVar13 = -1 << (bVar4 & 0x1f);
  if (histo_bits == 0) {
    uVar12 = 1;
    uVar13 = 0;
  }
  uVar10 = *histogram_symbols;
  VP8LRefsCursorInit(&local_48,refs);
  if (local_48.cur_pos != (PixOrCopy *)0x0) {
    local_90 = huffman_codes + (ulong)(uVar10 >> 8 & 0xffff) * 5;
    uVar10 = 0;
    uVar16 = 0;
    local_70 = 0;
    local_74 = 0;
    do {
      pPVar5 = local_48.cur_pos;
      if ((local_70 != (uVar10 & uVar13)) || (local_74 != (uVar16 & uVar13))) {
        local_90 = huffman_codes +
                   (ulong)*(ushort *)
                           ((long)histogram_symbols +
                           (long)(int)(((int)uVar10 >> (bVar4 & 0x1f)) +
                                      ((int)uVar16 >> (bVar4 & 0x1f)) * uVar12) * 4 + 1) * 5;
        local_74 = uVar16 & uVar13;
        local_70 = uVar10 & uVar13;
      }
      if ((local_48.cur_pos)->mode == '\x01') {
        uVar6 = (uint)local_90->code_lengths
                      [(long)(int)(local_48.cur_pos)->argb_or_distance + 0x118];
        if (local_90->code_lengths[(long)(int)(local_48.cur_pos)->argb_or_distance + 0x118] != 0) {
          uVar9 = (ulong)local_90->codes[(long)(int)(local_48.cur_pos)->argb_or_distance + 0x118];
          if (0x1f < bw->used) {
            VP8LPutBitsFlushBits(bw);
          }
LAB_0016ec3f:
          bw->bits = bw->bits | uVar9 << ((byte)bw->used & 0x3f);
          bw->used = uVar6 + bw->used;
        }
      }
      else if ((local_48.cur_pos)->mode == '\0') {
        ppuVar14 = &local_90->codes;
        lVar11 = 0;
        do {
          uVar6 = pPVar5->argb_or_distance >> (("\x01\x02"[lVar11] & 3) << 3) & 0xff;
          bVar1 = *(byte *)((long)ppuVar14[-1] + (ulong)uVar6);
          if (bVar1 != 0) {
            uVar2 = (*ppuVar14)[uVar6];
            if (0x1f < bw->used) {
              VP8LPutBitsFlushBits(bw);
            }
            bw->bits = bw->bits | (ulong)uVar2 << ((byte)bw->used & 0x3f);
            bw->used = (uint)bVar1 + bw->used;
          }
          lVar11 = lVar11 + 1;
          ppuVar14 = ppuVar14 + 3;
        } while (lVar11 != 4);
      }
      else {
        uVar9 = (ulong)(local_48.cur_pos)->len;
        if (uVar9 < 0x200) {
          uVar6 = (uint)kPrefixEncodeCode[uVar9].code;
          uVar17 = (uint)kPrefixEncodeCode[uVar9].extra_bits;
          uVar15 = (uint)""[uVar9];
        }
        else {
          uVar7 = (local_48.cur_pos)->len - 1;
          uVar6 = 0x1f;
          if (uVar7 != 0) {
            for (; uVar7 >> uVar6 == 0; uVar6 = uVar6 - 1) {
            }
          }
          uVar17 = 0x1e - (uVar6 ^ 0x1f);
          uVar15 = ~(-1 << ((byte)uVar17 & 0x1f)) & uVar7;
          uVar6 = (uint)((uVar7 >> (uVar17 & 0x1f) & 1) != 0) + (uVar6 ^ 0x1f) * 2 ^ 0x3e;
        }
        uVar3 = (local_48.cur_pos)->argb_or_distance;
        bVar1 = local_90->code_lengths[uVar6 + 0x100];
        iVar8 = uVar17 + bVar1;
        if (iVar8 != 0 && SCARRY4(uVar17,(uint)bVar1) == iVar8 < 0) {
          uVar2 = local_90->codes[uVar6 + 0x100];
          if (0x1f < bw->used) {
            VP8LPutBitsFlushBits(bw);
          }
          bw->bits = bw->bits |
                     (ulong)(uVar15 << (bVar1 & 0x1f) | (uint)uVar2) << ((byte)bw->used & 0x3f);
          bw->used = iVar8 + bw->used;
        }
        if ((int)uVar3 < 0x200) {
          uVar7 = (uint)kPrefixEncodeCode[(int)uVar3].code;
          uVar6 = (uint)kPrefixEncodeCode[(int)uVar3].extra_bits;
          uVar17 = (uint)""[(int)uVar3];
        }
        else {
          uVar15 = uVar3 - 1;
          uVar7 = 0x1f;
          if (uVar15 != 0) {
            for (; uVar15 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          uVar6 = 0x1e - (uVar7 ^ 0x1f);
          uVar17 = ~(-1 << ((byte)uVar6 & 0x1f)) & uVar15;
          uVar7 = (uint)((uVar15 >> (uVar6 & 0x1f) & 1) != 0) + (uVar7 ^ 0x1f) * 2 ^ 0x3e;
        }
        bVar1 = local_90[4].code_lengths[(int)uVar7];
        if (bVar1 != 0) {
          uVar2 = local_90[4].codes[(int)uVar7];
          if (0x1f < bw->used) {
            VP8LPutBitsFlushBits(bw);
          }
          bw->bits = bw->bits | (ulong)uVar2 << ((byte)bw->used & 0x3f);
          bw->used = (uint)bVar1 + bw->used;
        }
        if (0 < (int)uVar6) {
          if (0x1f < bw->used) {
            VP8LPutBitsFlushBits(bw);
          }
          uVar9 = (ulong)uVar17;
          goto LAB_0016ec3f;
        }
      }
      for (uVar10 = uVar10 + pPVar5->len; width <= (int)uVar10; uVar10 = uVar10 - width) {
        uVar16 = uVar16 + 1;
      }
      local_48.cur_pos = local_48.cur_pos + 1;
      if (local_48.cur_pos == local_48.last_pos) {
        VP8LRefsCursorNextBlock(&local_48);
      }
    } while (local_48.cur_pos != (PixOrCopy *)0x0);
  }
  iVar8 = 1;
  if (bw->error != 0) {
    iVar8 = WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return iVar8;
}

Assistant:

static int StoreImageToBitMask(VP8LBitWriter* const bw, int width,
                               int histo_bits,
                               const VP8LBackwardRefs* const refs,
                               const uint32_t* histogram_symbols,
                               const HuffmanTreeCode* const huffman_codes,
                               const WebPPicture* const pic) {
  const int histo_xsize = histo_bits ? VP8LSubSampleSize(width, histo_bits) : 1;
  const int tile_mask = (histo_bits == 0) ? 0 : -(1 << histo_bits);
  // x and y trace the position in the image.
  int x = 0;
  int y = 0;
  int tile_x = x & tile_mask;
  int tile_y = y & tile_mask;
  int histogram_ix = (histogram_symbols[0] >> 8) & 0xffff;
  const HuffmanTreeCode* codes = huffman_codes + 5 * histogram_ix;
  VP8LRefsCursor c = VP8LRefsCursorInit(refs);
  while (VP8LRefsCursorOk(&c)) {
    const PixOrCopy* const v = c.cur_pos;
    if ((tile_x != (x & tile_mask)) || (tile_y != (y & tile_mask))) {
      tile_x = x & tile_mask;
      tile_y = y & tile_mask;
      histogram_ix = (histogram_symbols[(y >> histo_bits) * histo_xsize +
                                        (x >> histo_bits)] >>
                      8) &
                     0xffff;
      codes = huffman_codes + 5 * histogram_ix;
    }
    if (PixOrCopyIsLiteral(v)) {
      static const uint8_t order[] = { 1, 2, 0, 3 };
      int k;
      for (k = 0; k < 4; ++k) {
        const int code = PixOrCopyLiteral(v, order[k]);
        WriteHuffmanCode(bw, codes + k, code);
      }
    } else if (PixOrCopyIsCacheIdx(v)) {
      const int code = PixOrCopyCacheIdx(v);
      const int literal_ix = 256 + NUM_LENGTH_CODES + code;
      WriteHuffmanCode(bw, codes, literal_ix);
    } else {
      int bits, n_bits;
      int code;

      const int distance = PixOrCopyDistance(v);
      VP8LPrefixEncode(v->len, &code, &n_bits, &bits);
      WriteHuffmanCodeWithExtraBits(bw, codes, 256 + code, bits, n_bits);

      // Don't write the distance with the extra bits code since
      // the distance can be up to 18 bits of extra bits, and the prefix
      // 15 bits, totaling to 33, and our PutBits only supports up to 32 bits.
      VP8LPrefixEncode(distance, &code, &n_bits, &bits);
      WriteHuffmanCode(bw, codes + 4, code);
      VP8LPutBits(bw, bits, n_bits);
    }
    x += PixOrCopyLength(v);
    while (x >= width) {
      x -= width;
      ++y;
    }
    VP8LRefsCursorNext(&c);
  }
  if (bw->error) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return 1;
}